

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBodyVisitor.cpp
# Opt level: O0

void __thiscall OpenMD::LipidHeadVisitor::visit(LipidHeadVisitor *this,RigidBody *rb)

{
  double dVar1;
  int iVar2;
  bool bVar3;
  ostream *poVar4;
  element_type *peVar5;
  double *pdVar6;
  StuntDouble *this_00;
  StuntDouble *in_RSI;
  RotMat3x3d rotMatrix;
  bool haveAtomData;
  shared_ptr<OpenMD::AtomInfo> atomInfo;
  shared_ptr<OpenMD::AtomData> atomData;
  shared_ptr<OpenMD::GenericData> data;
  Vector3d newVec;
  Vector3d u;
  Vector3d pos;
  int globalID;
  string *in_stack_fffffffffffffc88;
  AtomData *in_stack_fffffffffffffc90;
  StuntDouble *in_stack_fffffffffffffc98;
  LipidHeadVisitor *in_stack_fffffffffffffca0;
  shared_ptr<OpenMD::GenericData> *in_stack_fffffffffffffca8;
  Vector<double,_3U> *in_stack_fffffffffffffcb0;
  RectMatrix<double,_3U,_3U> *in_stack_fffffffffffffcb8;
  shared_ptr<OpenMD::GenericData> *genData;
  allocator<char> *in_stack_fffffffffffffcc0;
  char *in_stack_fffffffffffffcc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  shared_ptr<OpenMD::GenericData> local_270;
  allocator<char> local_259;
  string local_258 [96];
  string local_1f8 [55];
  allocator<char> local_1c1;
  string local_1c0 [172];
  undefined4 local_114;
  string local_110 [127];
  bool local_91;
  Vector<double,_3U> local_60 [2];
  Vector<double,_3U> local_30;
  int local_14;
  StuntDouble *local_10;
  
  local_10 = in_RSI;
  Vector3<double>::Vector3((Vector3<double> *)0x351944);
  Vector3<double>::Vector3
            ((Vector3<double> *)in_stack_fffffffffffffca0,(double)in_stack_fffffffffffffc98,
             (double)in_stack_fffffffffffffc90,(double)in_stack_fffffffffffffc88);
  Vector3<double>::Vector3((Vector3<double> *)0x35196c);
  std::shared_ptr<OpenMD::GenericData>::shared_ptr((shared_ptr<OpenMD::GenericData> *)0x351979);
  std::shared_ptr<OpenMD::AtomData>::shared_ptr((shared_ptr<OpenMD::AtomData> *)0x351986);
  std::shared_ptr<OpenMD::AtomInfo>::shared_ptr((shared_ptr<OpenMD::AtomInfo> *)0x351993);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x3519a0);
  (*local_10->_vptr_StuntDouble[7])(local_110);
  bVar3 = canVisit(in_stack_fffffffffffffca0,(string *)in_stack_fffffffffffffc98);
  std::__cxx11::string::~string(local_110);
  if (((bVar3 ^ 0xffU) & 1) == 0) {
    local_14 = StuntDouble::getGlobalIndex(local_10);
    StuntDouble::getPos(in_stack_fffffffffffffc98);
    Vector3<double>::operator=
              ((Vector3<double> *)in_stack_fffffffffffffc90,
               (Vector3<double> *)in_stack_fffffffffffffc88);
    StuntDouble::getA(in_stack_fffffffffffffc98);
    SquareMatrix3<double>::operator=
              ((SquareMatrix3<double> *)in_stack_fffffffffffffc90,
               (SquareMatrix3<double> *)in_stack_fffffffffffffc88);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x351afa);
    OpenMD::operator*(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
    Vector3<double>::operator=
              ((Vector3<double> *)in_stack_fffffffffffffc98,
               (Vector<double,_3U> *)in_stack_fffffffffffffc90);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
    StuntDouble::getPropertyByName(in_stack_fffffffffffffc98,(string *)in_stack_fffffffffffffc90);
    std::shared_ptr<OpenMD::GenericData>::operator=
              ((shared_ptr<OpenMD::GenericData> *)in_stack_fffffffffffffc90,
               (shared_ptr<OpenMD::GenericData> *)in_stack_fffffffffffffc88);
    std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x351bb4);
    std::__cxx11::string::~string(local_1c0);
    std::allocator<char>::~allocator(&local_1c1);
    bVar3 = std::operator!=((shared_ptr<OpenMD::GenericData> *)in_stack_fffffffffffffc90,
                            in_stack_fffffffffffffc88);
    if (bVar3) {
      std::dynamic_pointer_cast<OpenMD::AtomData,OpenMD::GenericData>(in_stack_fffffffffffffca8);
      std::shared_ptr<OpenMD::AtomData>::operator=
                ((shared_ptr<OpenMD::AtomData> *)in_stack_fffffffffffffc90,
                 (shared_ptr<OpenMD::AtomData> *)in_stack_fffffffffffffc88);
      std::shared_ptr<OpenMD::AtomData>::~shared_ptr((shared_ptr<OpenMD::AtomData> *)0x351c1f);
      local_91 = std::operator==((shared_ptr<OpenMD::AtomData> *)in_stack_fffffffffffffc90,
                                 in_stack_fffffffffffffc88);
      if (local_91) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"can not get Atom Data from ");
        (*local_10->_vptr_StuntDouble[7])(local_1f8);
        poVar4 = std::operator<<(poVar4,local_1f8);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_1f8);
        std::make_shared<OpenMD::AtomData>();
        std::shared_ptr<OpenMD::AtomData>::operator=
                  ((shared_ptr<OpenMD::AtomData> *)in_stack_fffffffffffffc90,
                   (shared_ptr<OpenMD::AtomData> *)in_stack_fffffffffffffc88);
        std::shared_ptr<OpenMD::AtomData>::~shared_ptr((shared_ptr<OpenMD::AtomData> *)0x351ce4);
      }
      local_91 = !local_91;
    }
    else {
      std::make_shared<OpenMD::AtomData>();
      std::shared_ptr<OpenMD::AtomData>::operator=
                ((shared_ptr<OpenMD::AtomData> *)in_stack_fffffffffffffc90,
                 (shared_ptr<OpenMD::AtomData> *)in_stack_fffffffffffffc88);
      std::shared_ptr<OpenMD::AtomData>::~shared_ptr((shared_ptr<OpenMD::AtomData> *)0x351dc1);
      local_91 = false;
    }
    std::make_shared<OpenMD::AtomInfo>();
    std::shared_ptr<OpenMD::AtomInfo>::operator=
              ((shared_ptr<OpenMD::AtomInfo> *)in_stack_fffffffffffffc90,
               (shared_ptr<OpenMD::AtomInfo> *)in_stack_fffffffffffffc88);
    std::shared_ptr<OpenMD::AtomInfo>::~shared_ptr((shared_ptr<OpenMD::AtomInfo> *)0x351e0a);
    peVar5 = std::__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x351e17);
    std::__cxx11::string::operator=((string *)peVar5,"X");
    iVar2 = local_14;
    peVar5 = std::__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x351e43);
    peVar5->globalID = iVar2;
    pdVar6 = Vector<double,_3U>::operator[](&local_30,0);
    dVar1 = *pdVar6;
    peVar5 = std::__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x351e88);
    pdVar6 = Vector<double,_3U>::operator[](&(peVar5->pos).super_Vector<double,_3U>,0);
    *pdVar6 = dVar1;
    pdVar6 = Vector<double,_3U>::operator[](&local_30,1);
    dVar1 = *pdVar6;
    peVar5 = std::__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x351ef3);
    pdVar6 = Vector<double,_3U>::operator[](&(peVar5->pos).super_Vector<double,_3U>,1);
    *pdVar6 = dVar1;
    pdVar6 = Vector<double,_3U>::operator[](&local_30,2);
    dVar1 = *pdVar6;
    peVar5 = std::__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x351f5e);
    pdVar6 = Vector<double,_3U>::operator[](&(peVar5->pos).super_Vector<double,_3U>,2);
    *pdVar6 = dVar1;
    pdVar6 = Vector<double,_3U>::operator[](local_60,0);
    dVar1 = *pdVar6;
    peVar5 = std::__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x351fbd);
    pdVar6 = Vector<double,_3U>::operator[](&(peVar5->vec).super_Vector<double,_3U>,0);
    *pdVar6 = dVar1;
    pdVar6 = Vector<double,_3U>::operator[](local_60,1);
    this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*pdVar6;
    peVar5 = std::__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x352016);
    pdVar6 = Vector<double,_3U>::operator[](&(peVar5->vec).super_Vector<double,_3U>,1);
    *pdVar6 = (double)this_01;
    pdVar6 = Vector<double,_3U>::operator[](local_60,2);
    genData = (shared_ptr<OpenMD::GenericData> *)*pdVar6;
    peVar5 = std::__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x352072);
    this_00 = (StuntDouble *)
              Vector<double,_3U>::operator[](&(peVar5->vec).super_Vector<double,_3U>,2);
    this_00->_vptr_StuntDouble = (_func_int **)genData;
    std::__shared_ptr_access<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x3520a6);
    std::shared_ptr<OpenMD::AtomInfo>::shared_ptr
              ((shared_ptr<OpenMD::AtomInfo> *)in_stack_fffffffffffffc90,
               (shared_ptr<OpenMD::AtomInfo> *)in_stack_fffffffffffffc88);
    AtomData::addAtomInfo
              (in_stack_fffffffffffffc90,(shared_ptr<OpenMD::AtomInfo> *)in_stack_fffffffffffffc88);
    std::shared_ptr<OpenMD::AtomInfo>::~shared_ptr((shared_ptr<OpenMD::AtomInfo> *)0x3520e3);
    if ((local_91 & 1U) == 0) {
      std::__shared_ptr_access<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x3520fe);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_01,(char *)pdVar6,(allocator<char> *)this_00);
      GenericData::setID(&in_stack_fffffffffffffc90->super_GenericData,in_stack_fffffffffffffc88);
      std::__cxx11::string::~string(local_258);
      std::allocator<char>::~allocator(&local_259);
      std::shared_ptr<OpenMD::GenericData>::shared_ptr<OpenMD::AtomData,void>
                (&local_270,(shared_ptr<OpenMD::AtomData> *)local_10);
      StuntDouble::addProperty(this_00,genData);
      std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x3521a1)
      ;
    }
    local_114 = 0;
  }
  else {
    local_114 = 1;
  }
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x35224d);
  std::shared_ptr<OpenMD::AtomInfo>::~shared_ptr((shared_ptr<OpenMD::AtomInfo> *)0x35225a);
  std::shared_ptr<OpenMD::AtomData>::~shared_ptr((shared_ptr<OpenMD::AtomData> *)0x352267);
  std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x352274);
  return;
}

Assistant:

void LipidHeadVisitor::visit(RigidBody* rb) {
    int globalID;
    Vector3d pos;
    Vector3d u(0, 0, 1);
    Vector3d newVec;
    std::shared_ptr<GenericData> data;
    std::shared_ptr<AtomData> atomData;
    std::shared_ptr<AtomInfo> atomInfo;
    bool haveAtomData;
    RotMat3x3d rotMatrix;

    if (!canVisit(rb->getType())) return;

    globalID  = rb->getGlobalIndex();
    pos       = rb->getPos();
    rotMatrix = rb->getA();
    // matVecMul3(rotMatrix, u, newVec);
    newVec = rotMatrix * u;

    data = rb->getPropertyByName("ATOMDATA");

    if (data != nullptr) {
      atomData = std::dynamic_pointer_cast<AtomData>(data);

      if (atomData == nullptr) {
        std::cerr << "can not get Atom Data from " << rb->getType()
                  << std::endl;

        atomData     = std::make_shared<AtomData>();
        haveAtomData = false;

      } else
        haveAtomData = true;

    } else {
      atomData     = std::make_shared<AtomData>();
      haveAtomData = false;
    }

    atomInfo               = std::make_shared<AtomInfo>();
    atomInfo->atomTypeName = "X";
    atomInfo->globalID     = globalID;
    atomInfo->pos[0]       = pos[0];
    atomInfo->pos[1]       = pos[1];
    atomInfo->pos[2]       = pos[2];
    atomInfo->vec[0]       = newVec[0];
    atomInfo->vec[1]       = newVec[1];
    atomInfo->vec[2]       = newVec[2];

    atomData->addAtomInfo(atomInfo);

    if (!haveAtomData) {
      atomData->setID("ATOMDATA");
      rb->addProperty(atomData);
    }
  }